

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineRecord2.cpp
# Opt level: O2

KDataStream * __thiscall
KDIS::DATA_TYPE::LineRecord2::Encode(KDataStream *__return_storage_ptr__,LineRecord2 *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream LineRecord2::Encode() const
{
    KDataStream stream;

    LineRecord2::Encode( stream );

    return stream;
}